

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000016f600 = 0x2e2e2e2e2e2e2e;
    uRam000000000016f607 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0016f5f0 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016f5f8 = 0x2e2e2e2e2e2e2e;
    DAT_0016f5ff = 0x2e;
    _DAT_0016f5e0 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016f5e8 = 0x2e2e2e2e2e2e2e2e;
    _DAT_0016f5d0 = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016f5d8 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam000000000016f5c8 = 0x2e2e2e2e2e2e2e2e;
    DAT_0016f60f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }